

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O1

int __thiscall Parse::selectionStmt(Parse *this)

{
  KeyWordTable *pKVar1;
  DelimiterTable *pDVar2;
  vector<QuadTuple,_std::allocator<QuadTuple>_> *pvVar3;
  pointer pTVar4;
  pointer pcVar5;
  int iVar6;
  int iVar7;
  mapped_type *pmVar8;
  long lVar9;
  ostream *poVar10;
  char *pcVar11;
  bool bVar12;
  QuadTuple local_338;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  key_type local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  key_type local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  key_type local_70;
  key_type local_50;
  
  if ((this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
      super__Vector_impl_data._M_start[this->curIndex].type == KEYWORD) {
    pKVar1 = this->keyWordTable;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"if","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&(pKVar1->
                           super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ).index,&local_50);
    bVar12 = *pmVar8 ==
             (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
             super__Vector_impl_data._M_start[this->curIndex].id;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar12 = false;
  }
  if (!bVar12) {
    return 0;
  }
  lVar9 = (long)this->curIndex + 1;
  this->curIndex = (int)lVar9;
  if ((this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar9].type == DELIMTER) {
    pDVar2 = this->delimiterTable;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"(","");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&(pDVar2->
                           super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ).index,&local_70);
    bVar12 = *pmVar8 ==
             (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
             super__Vector_impl_data._M_start[this->curIndex].id;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar12 = false;
  }
  if (bVar12) {
    this->curIndex = this->curIndex + 1;
    pvVar3 = this->quadVec;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"if","");
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"__","");
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"__","");
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"__","");
    QuadTuple::QuadTuple(&local_338,&local_90,&local_b0,&local_d0,&local_f0);
    std::vector<QuadTuple,_std::allocator<QuadTuple>_>::emplace_back<QuadTuple>(pvVar3,&local_338);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338.res._M_dataplus._M_p != &local_338.res.field_2) {
      operator_delete(local_338.res._M_dataplus._M_p,local_338.res.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338.name2._M_dataplus._M_p != &local_338.name2.field_2) {
      operator_delete(local_338.name2._M_dataplus._M_p,
                      local_338.name2.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338.name1._M_dataplus._M_p != &local_338.name1.field_2) {
      operator_delete(local_338.name1._M_dataplus._M_p,
                      local_338.name1.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338.op._M_dataplus._M_p != &local_338.op.field_2) {
      operator_delete(local_338.op._M_dataplus._M_p,local_338.op.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    iVar6 = expression(this);
    pTVar4 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (iVar6 == 0) {
      poVar10 = std::operator<<((ostream *)&std::cout,(string *)&pTVar4[this->curIndex].name);
      std::endl<char,std::char_traits<char>>(poVar10);
      pcVar11 = anon_var_dwarf_33f74;
    }
    else {
      if (pTVar4[this->curIndex].type == DELIMTER) {
        pDVar2 = this->delimiterTable;
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,")","");
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](&(pDVar2->
                               super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ).index,&local_110);
        bVar12 = *pmVar8 ==
                 (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                 super__Vector_impl_data._M_start[this->curIndex].id;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        bVar12 = false;
      }
      if (bVar12) {
        this->curIndex = this->curIndex + 1;
        pvVar3 = this->quadVec;
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"ifbegin","");
        pcVar5 = (this->curTmpName)._M_dataplus._M_p;
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_150,pcVar5,pcVar5 + (this->curTmpName)._M_string_length);
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"__","");
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"__","");
        QuadTuple::QuadTuple(&local_338,&local_130,&local_150,&local_170,&local_190);
        std::vector<QuadTuple,_std::allocator<QuadTuple>_>::emplace_back<QuadTuple>
                  (pvVar3,&local_338);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338.res._M_dataplus._M_p != &local_338.res.field_2) {
          operator_delete(local_338.res._M_dataplus._M_p,
                          local_338.res.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338.name2._M_dataplus._M_p != &local_338.name2.field_2) {
          operator_delete(local_338.name2._M_dataplus._M_p,
                          local_338.name2.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338.name1._M_dataplus._M_p != &local_338.name1.field_2) {
          operator_delete(local_338.name1._M_dataplus._M_p,
                          local_338.name1.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338.op._M_dataplus._M_p != &local_338.op.field_2) {
          operator_delete(local_338.op._M_dataplus._M_p,
                          local_338.op.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190._M_dataplus._M_p != &local_190.field_2) {
          operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        iVar6 = statement(this);
        if (iVar6 != 0) {
          if ((this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
              super__Vector_impl_data._M_start[this->curIndex].type == KEYWORD) {
            pKVar1 = this->keyWordTable;
            local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"else","");
            pmVar8 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[](&(pKVar1->
                                   super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ).index,&local_1b0);
            bVar12 = *pmVar8 ==
                     (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                     super__Vector_impl_data._M_start[this->curIndex].id;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
              operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            bVar12 = false;
          }
          if (!bVar12) {
LAB_0010cc28:
            pvVar3 = this->quadVec;
            local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"ifend","");
            local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"__","");
            local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"__","");
            local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"__","");
            QuadTuple::QuadTuple(&local_338,&local_250,&local_270,&local_290,&local_2b0);
            std::vector<QuadTuple,_std::allocator<QuadTuple>_>::emplace_back<QuadTuple>
                      (pvVar3,&local_338);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_338.res._M_dataplus._M_p != &local_338.res.field_2) {
              operator_delete(local_338.res._M_dataplus._M_p,
                              local_338.res.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_338.name2._M_dataplus._M_p != &local_338.name2.field_2) {
              operator_delete(local_338.name2._M_dataplus._M_p,
                              local_338.name2.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_338.name1._M_dataplus._M_p != &local_338.name1.field_2) {
              operator_delete(local_338.name1._M_dataplus._M_p,
                              local_338.name1.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_338.op._M_dataplus._M_p != &local_338.op.field_2) {
              operator_delete(local_338.op._M_dataplus._M_p,
                              local_338.op.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
              operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_dataplus._M_p != &local_290.field_2) {
              operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_270._M_dataplus._M_p != &local_270.field_2) {
              operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
            return 1;
          }
          pvVar3 = this->quadVec;
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"else","");
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"__","");
          local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"__","");
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"__","");
          QuadTuple::QuadTuple(&local_338,&local_1d0,&local_1f0,&local_210,&local_230);
          std::vector<QuadTuple,_std::allocator<QuadTuple>_>::emplace_back<QuadTuple>
                    (pvVar3,&local_338);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_338.res._M_dataplus._M_p != &local_338.res.field_2) {
            operator_delete(local_338.res._M_dataplus._M_p,
                            local_338.res.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_338.name2._M_dataplus._M_p != &local_338.name2.field_2) {
            operator_delete(local_338.name2._M_dataplus._M_p,
                            local_338.name2.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_338.name1._M_dataplus._M_p != &local_338.name1.field_2) {
            operator_delete(local_338.name1._M_dataplus._M_p,
                            local_338.name1.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_338.op._M_dataplus._M_p != &local_338.op.field_2) {
            operator_delete(local_338.op._M_dataplus._M_p,
                            local_338.op.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
          iVar6 = this->curIndex;
          this->curIndex = iVar6 + 1;
          iVar6 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                  super__Vector_impl_data._M_start[(long)iVar6 + 1].line;
          iVar7 = statement(this);
          if (iVar7 != 0) goto LAB_0010cc28;
          poVar10 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_33fbe);
          goto LAB_0010ceb1;
        }
        pcVar11 = anon_var_dwarf_33f98;
      }
      else {
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->curIndex);
        std::endl<char,std::char_traits<char>>(poVar10);
        poVar10 = std::operator<<((ostream *)&std::cout,
                                  (string *)
                                  &(this->tokenVec->
                                   super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                                   super__Vector_impl_data._M_start[this->curIndex].name);
        std::endl<char,std::char_traits<char>>(poVar10);
        pcVar11 = anon_var_dwarf_33f80;
      }
    }
  }
  else {
    pcVar11 = anon_var_dwarf_33f5a;
  }
  poVar10 = std::operator<<((ostream *)&std::cout,pcVar11);
  iVar6 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
          super__Vector_impl_data._M_start[this->curIndex].line;
LAB_0010ceb1:
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar6);
  poVar10 = std::operator<<(poVar10,anon_var_dwarf_33d22);
  std::endl<char,std::char_traits<char>>(poVar10);
  exit(0);
}

Assistant:

int Parse::selectionStmt() {
    if (tokenVec[curIndex].type == KEYWORD && keyWordTable.index["if"] == tokenVec[curIndex].id) {
        curIndex++;
        int line = tokenVec[curIndex].line;
        if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index["("] == tokenVec[curIndex].id) {
            curIndex++;
            quadVec.emplace_back(QuadTuple("if", "__", "__", "__"));
        } else {
            cout << "if语句缺少左括号在第" << tokenVec[curIndex].line  << "行" << endl;
            exit(0);
        }
        if(!expression()) {
            cout << tokenVec[curIndex].name << endl;
            cout << "if语句表达式错误在第" << tokenVec[curIndex].line  << "行" << endl;
            exit(0);
        }
        if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index[")"] == tokenVec[curIndex].id) {
            curIndex++;
        } else {
            cout << curIndex << endl;
            cout << tokenVec[curIndex].name  << endl;
            cout << "if语句缺少右括号在第" << tokenVec[curIndex].line  << "行" << endl;
            exit(0);
        }
        quadVec.emplace_back(QuadTuple("ifbegin", curTmpName, "__", "__"));
        //sem.pop();
        if(!statement()) {
            cout << "statement语句表达式错误在第" << tokenVec[curIndex].line  << "行" << endl;
            exit(0);
        }
        if (tokenVec[curIndex].type == KEYWORD && keyWordTable.index["else"] == tokenVec[curIndex].id) {
            quadVec.emplace_back(QuadTuple("else", "__", "__", "__"));
            curIndex++;
            int elseLine = tokenVec[curIndex].line;
            if(!statement()) {
                cout << "else 语句表达式错误在第"  << elseLine << "行" << endl;
                exit(0);
            }
        }
        quadVec.emplace_back(QuadTuple("ifend", "__", "__", "__"));
        return 1;
    }
    return 0;
}